

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O1

int luaD_precall(lua_State *L,StkId func,int nresults)

{
  lua_CFunction *pp_Var1;
  byte bVar2;
  long lVar3;
  lua_CFunction p_Var4;
  StkId pTVar5;
  uint uVar6;
  int iVar7;
  TValue *pTVar8;
  CallInfo *pCVar9;
  uint uVar10;
  StkId pTVar11;
  long lVar12;
  StkId pTVar13;
  
  while( true ) {
    lVar12 = (long)func - (long)L->stack;
    uVar6 = func->tt_ & 0x3f;
    if (uVar6 == 6) {
      lVar3 = *(long *)((func->value_).f + 0x18);
      if ((long)L->stack_last - (long)L->top >> 4 <= (long)(ulong)*(byte *)(lVar3 + 0x7a)) {
        luaD_growstack(L,(uint)*(byte *)(lVar3 + 0x7a));
      }
      pTVar13 = (StkId)(lVar12 + (long)L->stack);
      bVar2 = *(byte *)(lVar3 + 0x78);
      uVar6 = (uint)bVar2;
      iVar7 = (int)((ulong)((long)L->top - (long)pTVar13) >> 4);
      if ((int)(uint)bVar2 < iVar7) {
        uVar10 = iVar7 - 1;
      }
      else {
        pTVar11 = L->top;
        iVar7 = (uVar6 - iVar7) + 1;
        do {
          pTVar11->tt_ = 0;
          pTVar11 = pTVar11 + 1;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        L->top = pTVar11;
        uVar10 = uVar6;
      }
      if (*(char *)(lVar3 + 0x79) == '\0') {
        pTVar11 = pTVar13 + 1;
      }
      else {
        pTVar11 = L->top;
        if (uVar6 != 0) {
          lVar12 = 0;
          do {
            pTVar5 = L->top;
            L->top = pTVar5 + 1;
            pTVar5->value_ = *(Value *)((long)&pTVar11[-(ulong)uVar10].value_ + lVar12);
            pTVar5->tt_ = *(int *)((long)&pTVar11[-(ulong)uVar10].tt_ + lVar12);
            *(undefined4 *)((long)&pTVar11[-(ulong)uVar10].tt_ + lVar12) = 0;
            lVar12 = lVar12 + 0x10;
          } while ((ulong)bVar2 << 4 != lVar12);
        }
      }
      pCVar9 = L->ci->next;
      if (pCVar9 == (CallInfo *)0x0) {
        pCVar9 = luaE_extendCI(L);
      }
      L->ci = pCVar9;
      pCVar9->nresults = (short)nresults;
      pCVar9->func = pTVar13;
      (pCVar9->u).l.base = pTVar11;
      bVar2 = *(byte *)(lVar3 + 0x7a);
      pCVar9->top = pTVar11 + bVar2;
      (pCVar9->u).l.savedpc = *(Instruction **)(lVar3 + 0x18);
      pCVar9->callstatus = '\x01';
      L->top = pTVar11 + bVar2;
      if ((L->hookmask & 1) != 0) {
        pp_Var1 = &(pCVar9->u).c.k;
        *pp_Var1 = *pp_Var1 + 4;
        iVar7 = 0;
        if (((pCVar9->previous->callstatus & 1) != 0) &&
           ((*(uint *)((pCVar9->previous->u).c.k + -4) & 0x3f) == 0x1e)) {
          pCVar9->callstatus = 'A';
          iVar7 = 4;
        }
        luaD_hook(L,iVar7,-1);
        pp_Var1 = &(pCVar9->u).c.k;
        *pp_Var1 = *pp_Var1 + -4;
      }
      return 0;
    }
    if (uVar6 == 0x16) break;
    if (uVar6 == 0x26) {
      func = (StkId)((func->value_).f + 0x18);
      break;
    }
    pTVar8 = luaT_gettmbyobj(L,func,TM_CALL);
    if ((pTVar8->tt_ & 0xfU) != 6) {
      luaG_typeerror(L,func,"call");
    }
    pTVar11 = L->stack;
    for (pTVar13 = L->top; func < pTVar13; pTVar13 = pTVar13 + -1) {
      pTVar13->value_ = pTVar13[-1].value_;
      pTVar13->tt_ = pTVar13[-1].tt_;
    }
    pTVar13 = L->top;
    L->top = pTVar13 + 1;
    if ((long)L->stack_last - (long)(pTVar13 + 1) < 0x10) {
      luaD_growstack(L,0);
    }
    lVar12 = (long)func - (long)pTVar11;
    pTVar13 = L->stack;
    *(Value *)((long)pTVar13 + lVar12) = pTVar8->value_;
    *(int *)((long)pTVar13 + lVar12 + 8) = pTVar8->tt_;
    func = (StkId)(lVar12 + (long)pTVar13);
  }
  p_Var4 = (func->value_).f;
  if ((long)L->stack_last - (long)L->top < 0x150) {
    luaD_growstack(L,0x14);
  }
  pCVar9 = L->ci->next;
  if (pCVar9 == (CallInfo *)0x0) {
    pCVar9 = luaE_extendCI(L);
  }
  L->ci = pCVar9;
  pCVar9->nresults = (short)nresults;
  pCVar9->func = (StkId)(lVar12 + (long)L->stack);
  pCVar9->top = L->top + 0x14;
  pCVar9->callstatus = '\0';
  if ((L->hookmask & 1) != 0) {
    luaD_hook(L,0,-1);
  }
  iVar7 = (*p_Var4)(L);
  luaD_poscall(L,L->top + -(long)iVar7);
  return 1;
}

Assistant:

int luaD_precall (lua_State *L, StkId func, int nresults) {
  lua_CFunction f;
  CallInfo *ci;
  int n;  /* number of arguments (Lua) or returns (C) */
  ptrdiff_t funcr = savestack(L, func);
  switch (ttype(func)) {
    case LUA_TLCF:  /* light C function */
      f = fvalue(func);
      goto Cfunc;
    case LUA_TCCL: {  /* C closure */
      f = clCvalue(func)->f;
     Cfunc:
      luaD_checkstack(L, LUA_MINSTACK);  /* ensure minimum stack size */
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = restorestack(L, funcr);
      ci->top = L->top + LUA_MINSTACK;
      lua_assert(ci->top <= L->stack_last);
      ci->callstatus = 0;
      if (L->hookmask & LUA_MASKCALL)
        luaD_hook(L, LUA_HOOKCALL, -1);
      lua_unlock(L);
      n = (*f)(L);  /* do the actual call */
      lua_lock(L);
      api_checknelems(L, n);
      luaD_poscall(L, L->top - n);
      return 1;
    }
    case LUA_TLCL: {  /* Lua function: prepare its call */
      StkId base;
      Proto *p = clLvalue(func)->p;
      luaD_checkstack(L, p->maxstacksize);
      func = restorestack(L, funcr);
      n = cast_int(L->top - func) - 1;  /* number of real arguments */
      for (; n < p->numparams; n++)
        setnilvalue(L->top++);  /* complete missing arguments */
      base = (!p->is_vararg) ? func + 1 : adjust_varargs(L, p, n);
      ci = next_ci(L);  /* now 'enter' new function */
      ci->nresults = nresults;
      ci->func = func;
      ci->u.l.base = base;
      ci->top = base + p->maxstacksize;
      lua_assert(ci->top <= L->stack_last);
      ci->u.l.savedpc = p->code;  /* starting point */
      ci->callstatus = CIST_LUA;
      L->top = ci->top;
      if (L->hookmask & LUA_MASKCALL)
        callhook(L, ci);
      return 0;
    }
    default: {  /* not a function */
      func = tryfuncTM(L, func);  /* retry with 'function' tag method */
      return luaD_precall(L, func, nresults);  /* now it must be a function */
    }
  }
}